

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_table_insert(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint *puVar2;
  TRef TVar3;
  TRef TVar4;
  MSize MVar5;
  RecordIndex ix;
  TValue local_68;
  double local_60;
  uint local_38;
  TRef local_34;
  uint local_30;
  undefined4 local_24;
  
  puVar2 = J->base;
  local_38 = *puVar2;
  local_30 = puVar2[1];
  rd->nres = 0;
  if (local_30 != 0 && (local_38 & 0x1f000000) == 0xb000000) {
    if (puVar2[2] != 0) {
      recff_nyiu(J);
    }
    TVar3 = lj_ir_call(J,IRCALL_lj_tab_len);
    uVar1 = (rd->argv->u32).lo;
    TVar4 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x2813;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    local_34 = lj_opt_fold(J);
    local_68.field_2.it = 0xfffffff4;
    local_68.u32.lo = uVar1;
    MVar5 = lj_tab_len((GCtab *)(ulong)uVar1);
    local_60 = (double)(int)(MVar5 + 1);
    local_24 = 0;
    lj_record_idx(J,(RecordIndex *)&local_68.field_2);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_insert(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  ix.val = J->base[1];
  rd->nres = 0;
  if (tref_istab(ix.tab) && ix.val) {
    if (!J->base[2]) {  /* Simple push: t[#t+1] = v */
      TRef trlen = lj_ir_call(J, IRCALL_lj_tab_len, ix.tab);
      GCtab *t = tabV(&rd->argv[0]);
      ix.key = emitir(IRTI(IR_ADD), trlen, lj_ir_kint(J, 1));
      settabV(J->L, &ix.tabv, t);
      setintV(&ix.keyv, lj_tab_len(t) + 1);
      ix.idxchain = 0;
      lj_record_idx(J, &ix);  /* Set new value. */
    } else {  /* Complex case: insert in the middle. */
      recff_nyiu(J);
    }
  }  /* else: Interpreter will throw. */
}